

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalable_pipeline.cpp
# Opt level: O3

int main(void)

{
  _Atomic_word *p_Var1;
  weak_ptr<tf::Topology> *pwVar2;
  undefined1 *puVar3;
  U *pUVar4;
  FlowBuilder FVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  Node *pNVar9;
  undefined8 uVar10;
  bool bVar11;
  Executor *pEVar12;
  long lVar13;
  DefaultTaskParams local_409;
  Future<void> local_408;
  in_place_type_t<tf::Node::Module> local_3e1;
  Task stop;
  Task task;
  anon_class_8_1_69701ed9 local_3d0;
  vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  pipes;
  Task init;
  anon_class_8_1_4eff857e pipe_callable;
  shared_ptr<tf::WorkerInterface> local_398;
  Taskflow taskflow;
  Executor executor;
  array<unsigned_long,_4UL> buffer;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  pl;
  
  puVar3 = (undefined1 *)((long)&executor._taskflows_mutex.super___mutex_base._M_mutex + 0x10);
  executor._taskflows_mutex.super___mutex_base._M_mutex.__align = (long)puVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&executor,"pipeline","");
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&taskflow._name,executor._taskflows_mutex.super___mutex_base._M_mutex.__align
             ,executor._taskflows_mutex.super___mutex_base._M_mutex._8_8_ +
              executor._taskflows_mutex.super___mutex_base._M_mutex.__align);
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  if ((undefined1 *)executor._taskflows_mutex.super___mutex_base._M_mutex.__align != puVar3) {
    operator_delete((void *)executor._taskflows_mutex.super___mutex_base._M_mutex.__align,
                    executor._taskflows_mutex.super___mutex_base._M_mutex._16_8_ + 1);
  }
  uVar7 = std::thread::hardware_concurrency();
  local_398.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_398.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)uVar7,&local_398);
  if (local_398.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_398.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pipe_callable.buffer = &buffer;
  pipes.
  super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pipes.
  super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pipes.
  super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar13 = 3;
  do {
    pl._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
    std::
    vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>
    ::emplace_back<tf::PipeType,main::__2&>
              ((vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>
                *)&pipes,(PipeType *)&pl,&pipe_callable);
    lVar13 = lVar13 + -1;
  } while (lVar13 != 0);
  tf::
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  ::ScalablePipeline(&pl,4,(__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
                            )pipes.
                             super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
                      )pipes.
                       super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  FVar5 = taskflow.super_FlowBuilder;
  local_408.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_nstate = 0;
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_name).field_2;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_string_length = 0;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name).field_2._M_local_buf[0] = '\0';
  pUVar4 = &(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_data = (void *)0x0;
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_topology = (Topology *)0x0;
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_parent = (Node *)0x0;
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_num_successors = 0;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar4;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar4;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
       &((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_join_counter;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ._M_u + 8) = 0;
  *(code **)((long)&(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/scalable_pipeline.cpp:84:36)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/scalable_pipeline.cpp:84:36)>
       ::_M_manager;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_handle).
  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  ._M_index = '\x01';
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false> =
       (_Head_base<0UL,_tf::Node::Semaphores_*,_false>)0x0;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_exception_ptr)._M_exception_object = (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar5._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_408);
  if ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_408,
               (Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  }
  pNVar9 = ((FVar5._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  pwVar2 = &local_408._topology;
  local_408.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pwVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"starting pipeline","");
  std::__cxx11::string::_M_assign((string *)&pNVar9->_name);
  init._node = pNVar9;
  if (local_408.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pwVar2) {
    operator_delete(local_408.super_future<void>.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(ulong)((long)&(local_408._topology.
                                            super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->_taskflow + 1));
  }
  local_408.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3d0.repeat = 0;
  stop._node = (Node *)((ulong)stop._node._4_4_ << 0x20);
  pNVar9 = tf::Graph::
           _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Module>,tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void(tf::Pipeflow&)>>*,std::vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>>>&>
                     (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                      &local_409,(void **)&local_408,(void **)&local_3d0,(int *)&stop,&local_3e1,&pl
                     );
  local_408.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pwVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"pipeline","");
  std::__cxx11::string::_M_assign((string *)&pNVar9->_name);
  task._node = pNVar9;
  if (local_408.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pwVar2) {
    operator_delete(local_408.super_future<void>.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(ulong)((long)&(local_408._topology.
                                            super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->_taskflow + 1));
  }
  FVar5._graph = taskflow.super_FlowBuilder._graph;
  local_408.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_nstate = 0;
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_name).field_2;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name)._M_string_length = 0;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_name).field_2._M_local_buf[0] = '\0';
  pUVar4 = &(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_data = (void *)0x0;
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_topology = (Topology *)0x0;
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_parent = (Node *)0x0;
  ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->_num_successors = 0;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar4;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar4;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
       &((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_join_counter;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ._M_u + 8) = 0;
  *(code **)((long)&(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/scalable_pipeline.cpp:88:36)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    ._M_u + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/scalable_pipeline.cpp:88:36)>
       ::_M_manager;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_handle).
  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  .
  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  ._M_index = '\x01';
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false> =
       (_Head_base<0UL,_tf::Node::Semaphores_*,_false>)0x0;
  (((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->_exception_ptr)._M_exception_object = (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar5._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_408);
  if ((Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_408,
               (Node *)local_408.super_future<void>.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  }
  pNVar9 = ((FVar5._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_408.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pwVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"pipeline stopped","");
  std::__cxx11::string::_M_assign((string *)&pNVar9->_name);
  stop._node = pNVar9;
  if (local_408.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pwVar2) {
    operator_delete(local_408.super_future<void>.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(ulong)((long)&(local_408._topology.
                                            super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->_taskflow + 1));
  }
  tf::Task::precede<tf::Task&>(&init,&task);
  tf::Task::precede<tf::Task&>(&task,&stop);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"digraph Taskflow {\n",0x13);
  tf::Taskflow::_dump(&taskflow,(ostream *)&std::cout,&taskflow._graph);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
  local_3d0.repeat = 1;
  pEVar12 = &executor;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
            (&local_408,pEVar12,&taskflow,&local_3d0,(anon_class_1_0_00000001 *)&local_409);
  if (local_408.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (_State_baseV2 *)0x0) {
    std::__throw_future_error(3);
  }
  else {
    std::__future_base::_State_baseV2::wait
              (local_408.super_future<void>.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,pEVar12);
    if (local_408._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_408._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar8 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar8 = (local_408._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_408._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = iVar8 + -1;
      }
      if (iVar8 == 1) {
        (*(local_408._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (local_408.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_408.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar6 = true;
    do {
      bVar11 = bVar6;
      local_408.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(local_408.super_future<void>.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._4_4_,2);
      std::
      vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>
      ::emplace_back<tf::PipeType,main::__2&>
                ((vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>
                  *)&pipes,(PipeType *)&local_408,&pipe_callable);
      bVar6 = false;
    } while (bVar11);
    tf::
    ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
    ::reset(&pl,(__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
                 )pipes.
                  super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
            (__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
             )pipes.
              super__Vector_base<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
    local_3d0.repeat = 1;
    pEVar12 = &executor;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              (&local_408,pEVar12,&taskflow,&local_3d0,(anon_class_1_0_00000001 *)&local_409);
    if (local_408.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (_State_baseV2 *)0x0) {
      std::__future_base::_State_baseV2::wait
                (local_408.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pEVar12);
      if (local_408._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_408._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
          iVar8 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar8 = (local_408._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
          (local_408._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count = iVar8 + -1;
        }
        if (iVar8 == 1) {
          (*(local_408._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        }
      }
      if (local_408.super_future<void>.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_408.super_future<void>.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      tf::
      ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
      ::~ScalablePipeline(&pl);
      std::
      vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
      ::~vector(&pipes);
      tf::Executor::~Executor(&executor);
      tf::Taskflow::~Taskflow(&taskflow);
      return 0;
    }
  }
  uVar10 = std::__throw_future_error(3);
  tf::
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  ::~ScalablePipeline(&pl);
  std::
  vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  ::~vector(&pipes);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  _Unwind_Resume(uVar10);
}

Assistant:

int main() {

  tf::Taskflow taskflow("pipeline");
  tf::Executor executor;

  const size_t num_lines = 4;

  // create data storage
  std::array<size_t, num_lines> buffer;

  // define the pipe callable
  auto pipe_callable = [&buffer] (tf::Pipeflow& pf) mutable {
    switch(pf.pipe()) {
      // first stage generates only 5 scheduling tokens and saves the
      // token number into the buffer.
      case 0: {
        if(pf.token() == 5) {
          pf.stop();
        }
        else {
          printf("stage 1: input token = %zu\n", pf.token());
          buffer[pf.line()] = pf.token();
        }
        return;
      }
      break;

      // other stages propagate the previous result to this pipe and
      // increment it by one
      default: {
        printf(
          "stage %zu: input buffer[%zu] = %zu\n", pf.pipe(), pf.line(), buffer[pf.line()]
        );
        buffer[pf.line()] = buffer[pf.line()] + 1;
      }
      break;
    }
  };

  // create a vector of three pipes
  std::vector< tf::Pipe<std::function<void(tf::Pipeflow&)>> > pipes;

  for(size_t i=0; i<3; i++) {
    pipes.emplace_back(tf::PipeType::SERIAL, pipe_callable);
  }

  // create a pipeline of four parallel lines using the given vector of pipes
  tf::ScalablePipeline<decltype(pipes)::iterator> pl(num_lines, pipes.begin(), pipes.end());

  // build the pipeline graph using composition
  tf::Task init = taskflow.emplace([](){ std::cout << "ready\n"; })
                          .name("starting pipeline");
  tf::Task task = taskflow.composed_of(pl)
                          .name("pipeline");
  tf::Task stop = taskflow.emplace([](){ std::cout << "stopped\n"; })
                          .name("pipeline stopped");

  // create task dependency
  init.precede(task);
  task.precede(stop);

  // dump the pipeline graph structure (with composition)
  taskflow.dump(std::cout);

  // run the pipeline
  executor.run(taskflow).wait();

  // reset the pipeline to a new range of five pipes and starts from
  // the initial state (i.e., token counts from zero)
  for(size_t i=0; i<2; i++) {
    pipes.emplace_back(tf::PipeType::SERIAL, pipe_callable);
  }
  pl.reset(pipes.begin(), pipes.end());

  executor.run(taskflow).wait();

  return 0;
}